

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 void *src,size_t srcSize)

{
  void *pvVar1;
  rawSeq *prVar2;
  BYTE *pBVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar6;
  undefined8 *puVar7;
  seqDef *psVar8;
  uint uVar9;
  BYTE *pBVar10;
  ulong uVar12;
  ulong uVar13;
  ZSTD_dictMode_e dictMode;
  ulong uVar14;
  U32 UVar15;
  U32 UVar11;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    dictMode = (uint)(ms->dictMatchState != (ZSTD_matchState_t *)0x0) * 2;
  }
  uVar5 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE = ZSTD_selectBlockCompressor((ms->cParams).strategy,dictMode);
  pvVar1 = (void *)((long)src + srcSize);
  uVar12 = rawSeqStore->pos;
  if (0 < (long)srcSize && uVar12 < rawSeqStore->size) {
    while( true ) {
      prVar2 = rawSeqStore->seq + uVar12;
      uVar13._0_4_ = prVar2->offset;
      uVar13._4_4_ = prVar2->litLength;
      uVar14 = uVar13 >> 0x20;
      UVar15 = rawSeqStore->seq[uVar12].matchLength;
      uVar4 = (uint)((long)pvVar1 - (long)src);
      if (uVar4 < UVar15 + uVar13._4_4_) {
        uVar12 = uVar13;
        if (uVar4 - uVar13._4_4_ < uVar5) {
          uVar12 = 0;
        }
        UVar11 = uVar4 - uVar13._4_4_;
        if (uVar4 < (uint)uVar13._4_4_ || uVar4 - uVar13._4_4_ == 0) {
          uVar12 = 0;
          UVar11 = UVar15;
        }
        UVar15 = UVar11;
        ZSTD_ldm_skipSequences(rawSeqStore,(long)pvVar1 - (long)src & 0xffffffff,uVar5);
        uVar13 = uVar12;
      }
      else {
        rawSeqStore->pos = uVar12 + 1;
      }
      UVar11 = (U32)uVar13;
      if (UVar11 == 0) break;
      uVar4 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar4) {
        uVar9 = (uVar4 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar9) {
          uVar9 = 0x200;
        }
        ms->nextToUpdate = uVar4 - uVar9;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar14);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar11;
      puVar7 = (undefined8 *)((long)src + (uVar14 - sVar6));
      pBVar10 = seqStore->lit;
      pBVar3 = pBVar10 + sVar6;
      do {
        *(undefined8 *)pBVar10 = *puVar7;
        pBVar10 = pBVar10 + 8;
        puVar7 = puVar7 + 1;
      } while (pBVar10 < pBVar3);
      seqStore->lit = seqStore->lit + sVar6;
      if (sVar6 < 0x10000) {
        psVar8 = seqStore->sequences;
      }
      else {
        seqStore->longLengthID = 1;
        psVar8 = seqStore->sequences;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar8->litLength = (U16)sVar6;
      psVar8->offset = UVar11 + 3;
      if (0xffff < UVar15 - 3) {
        seqStore->longLengthID = 2;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar8->matchLength = (U16)(UVar15 - 3);
      seqStore->sequences = psVar8 + 1;
      src = (void *)((long)src + UVar15 + uVar14);
      uVar12 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar12) || (pvVar1 <= src)) break;
    }
  }
  uVar5 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar5) {
    uVar4 = (uVar5 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar4) {
      uVar4 = 0x200;
    }
    ms->nextToUpdate = uVar5 - uVar4;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar6 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)pvVar1 - (long)src);
  return sVar6;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "calling block compressor on segment of size %u", sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}